

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_statistics_csv(double *sketch_quantiles,double *exact_quantiles,int step)

{
  double local_38;
  double re;
  double dStack_28;
  int p;
  double avg_re;
  int step_local;
  double *exact_quantiles_local;
  double *sketch_quantiles_local;
  
  dStack_28 = 0.0;
  for (re._4_4_ = 0; re._4_4_ < 0x65; re._4_4_ = re._4_4_ + 1) {
    local_38 = 0.0;
    if (0.0 < ABS(exact_quantiles[re._4_4_])) {
      local_38 = ABS(sketch_quantiles[re._4_4_] - exact_quantiles[re._4_4_]) /
                 ABS(exact_quantiles[re._4_4_]);
      dStack_28 = local_38 + dStack_28;
    }
    if (re._4_4_ % step == 0) {
      printf("%.10f,",local_38);
    }
  }
  printf("%.10f,",dStack_28 / 101.0);
  return;
}

Assistant:

void print_statistics_csv(double *sketch_quantiles, double *exact_quantiles, int step){
    double avg_re = 0.0;
    for (int p = 0; p < 101; p++) {
        double re = 0.0;
        if (fabs(exact_quantiles[p]) > 0) {
            re = fabs((sketch_quantiles[p] - exact_quantiles[p])) / fabs(exact_quantiles[p]);
            avg_re += re;
        }
        if (!(p % step)) {
            printf("%.10f,", re);
        }
    }
    printf("%.10f,", avg_re/101.0);
}